

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O2

int makeemitters(int argc,char **argv)

{
  long lVar1;
  char *pcVar2;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar3;
  size_t sVar4;
  Point2i PVar5;
  bool bVar6;
  int c_1;
  Allocator alloc;
  Tuple2<pbrt::Point2,_int> TVar7;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar8;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  size_t sVar13;
  char *pcVar14;
  int dx;
  long lVar15;
  int iVar16;
  int iVar17;
  ulong uVar18;
  long lVar19;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  int downsampleRate;
  allocator<char> local_38e;
  allocator<char> local_38d;
  float local_38c;
  char **argv_local;
  float local_380;
  float local_37c;
  ulong local_378;
  ulong local_370;
  Tuple2<pbrt::Point2,_int> local_368;
  ulong local_360;
  long local_358;
  long local_350;
  long local_348;
  WrapMode2D local_340;
  ImageChannelValues pSum;
  string local_2f8 [32];
  _Any_data local_2d8;
  code *local_2c8;
  code *local_2c0;
  ImageChannelDesc rgbDesc;
  ImageChannelValues p;
  ColorEncodingHandle local_250;
  ImageAndMetadata im;
  
  downsampleRate = 1;
  pcVar14 = (char *)0x0;
  argv_local = argv;
  do {
    do {
      if (*argv_local == (char *)0x0) {
        if (pcVar14 != (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pSum,pcVar14,(allocator<char> *)&rgbDesc);
          alloc.memoryResource = pstd::pmr::new_delete_resource();
          local_250.
          super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
                   )0;
          pbrt::Image::Read(&im,(string *)&pSum,alloc,&local_250);
          std::__cxx11::string::~string((string *)&pSum);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&pSum,"R",(allocator<char> *)&p);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)
                     &pSum.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      nAlloc,"G",&local_38d);
          std::__cxx11::string::string<std::allocator<char>>(local_2f8,"B",&local_38e);
          requestedChannels.n = 3;
          requestedChannels.ptr =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pSum;
          pbrt::Image::GetChannelDesc(&rgbDesc,&im.image,requestedChannels);
          lVar11 = 0x40;
          do {
            std::__cxx11::string::~string
                      ((string *)
                       ((long)&pSum.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .alloc.memoryResource + lVar11));
            PVar5 = im.image.resolution;
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != -0x20);
          if (rgbDesc.offset.nStored == 0) {
            fprintf(_stderr,"%s: didn\'t find R, G, and B channels",pcVar14);
            iVar16 = 1;
          }
          else {
            iVar16 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
            local_370 = (ulong)im.image.resolution.super_Tuple2<pbrt::Point2,_int> >> 0x20;
            local_38c = (float)iVar16 / (float)im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y
            ;
            puts("AttributeBegin");
            puts("Material \"matte\" \"rgb Kd\" [0 0 0]");
            local_368 = PVar5.super_Tuple2<pbrt::Point2,_int>;
            local_348 = (long)PVar5.super_Tuple2<pbrt::Point2,_int> >> 0x20;
            local_380 = local_38c * -0.5;
            TVar7 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
            for (uVar18 = 0; iVar17 = (int)uVar18, iVar17 < TVar7.y;
                uVar18 = (ulong)(uint)((int)uVar18 + downsampleRate)) {
              local_37c = (float)iVar17;
              local_358 = (long)iVar17;
              uVar12 = 0;
              local_360 = uVar18;
              while ((int)uVar12 < TVar7.x) {
                local_378 = uVar12;
                pbrt::ImageChannelValues::ImageChannelValues(&pSum,rgbDesc.offset.nStored,0.0);
                lVar19 = (long)(int)local_378;
                lVar11 = 0;
                iVar17 = downsampleRate;
                while (sVar4 = pSum.
                               super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                               .nStored, uVar18 = local_360, lVar11 < iVar17) {
                  lVar1 = lVar11 + local_358;
                  local_350 = lVar11;
                  for (lVar15 = 0; lVar15 < iVar17; lVar15 = lVar15 + 1) {
                    if ((lVar15 + lVar19 < (long)iVar16) || (lVar1 < local_348)) {
                      pbrt::WrapMode2D::WrapMode2D(&local_340,Clamp);
                      pbrt::Image::GetChannels
                                (&p,&im.image,
                                 (Point2i)(lVar15 + lVar19 & 0xffffffffU | lVar1 << 0x20),&rgbDesc,
                                 local_340);
                      sVar4 = p.
                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                              .nStored;
                      paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                *)p.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .ptr;
                      if (p.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                          ptr == (float *)0x0) {
                        paVar8 = &p.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .field_2;
                      }
                      paVar9 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                                *)pSum.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .ptr;
                      if (pSum.
                          super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                          ptr == (float *)0x0) {
                        paVar9 = &pSum.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .field_2;
                      }
                      for (sVar13 = 0; sVar4 != sVar13; sVar13 = sVar13 + 1) {
                        paVar9->fixed[sVar13] = paVar8->fixed[sVar13] + paVar9->fixed[sVar13];
                      }
                      pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                      ~InlinedVector(&p.
                                      super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                    );
                      iVar17 = downsampleRate;
                    }
                  }
                  lVar11 = local_350 + 1;
                }
                paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                          *)pSum.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            ptr;
                if (pSum.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.ptr
                    == (float *)0x0) {
                  paVar8 = &pSum.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            field_2;
                }
                for (sVar13 = 0; sVar4 != sVar13; sVar13 = sVar13 + 1) {
                  paVar8->fixed[sVar13] = paVar8->fixed[sVar13] / (float)(iVar17 * iVar17);
                }
                bVar6 = pSum.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                        .ptr == (float *)0x0;
                paVar8 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                          *)pSum.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            ptr;
                if (bVar6) {
                  paVar8 = &pSum.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            field_2;
                }
                paVar9 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                          *)pSum.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            ptr;
                if (bVar6) {
                  paVar9 = &pSum.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            field_2;
                }
                paVar3 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                          *)pSum.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            ptr;
                if (bVar6) {
                  paVar3 = &pSum.
                            super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                            field_2;
                }
                printf("AreaLightSource \"diffuse\" \"rgb L\" [ %f %f %f ]\n",
                       (double)paVar8->fixed[0],(double)paVar9->fixed[1],(double)paVar3->fixed[2]);
                iVar10 = (int)local_378;
                iVar17 = downsampleRate + iVar10;
                if (local_368.x <= downsampleRate + iVar10) {
                  iVar17 = local_368.x;
                }
                vfmadd213ss_fma(ZEXT416((uint)(1.0 - (float)iVar10 /
                                                     (float)im.image.resolution.
                                                            super_Tuple2<pbrt::Point2,_int>.x)),
                                ZEXT416((uint)local_38c),ZEXT416((uint)local_380));
                vfmadd213ss_fma(ZEXT416((uint)(1.0 - (float)iVar17 /
                                                     (float)im.image.resolution.
                                                            super_Tuple2<pbrt::Point2,_int>.x)),
                                ZEXT416((uint)local_38c),ZEXT416((uint)local_380));
                printf("Shape \"bilinear\" \"point3 P\" [ %f %f 0 %f %f 0 %f %f 0 %f %f 0 ]\n");
                pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                ~InlinedVector(&pSum.
                                super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                              );
                TVar7 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>;
                uVar12 = (ulong)(uint)(iVar10 + downsampleRate);
              }
            }
            puts("AttributeEnd");
            iVar16 = 0;
          }
          pbrt::InlinedVector<int,_4,_pstd::pmr::polymorphic_allocator<int>_>::~InlinedVector
                    (&rgbDesc.offset);
          pbrt::ImageAndMetadata::~ImageAndMetadata(&im);
          return iVar16;
        }
        pcVar14 = "missing image filename";
LAB_0026325a:
        usage("makeemitters",pcVar14);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&im,"downsample",(allocator<char> *)&pSum);
      local_2d8._M_unused._M_object = (void *)0x0;
      local_2d8._8_8_ = 0;
      local_2c0 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1703:20)>
                  ::_M_invoke;
      local_2c8 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1703:20)>
                  ::_M_manager;
      bVar6 = pbrt::ParseArg<int*>
                        (&argv_local,(string *)&im,&downsampleRate,
                         (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                          *)&local_2d8);
      std::_Function_base::~_Function_base((_Function_base *)&local_2d8);
      std::__cxx11::string::~string((string *)&im);
    } while (bVar6);
    pcVar2 = *argv_local;
    if (*pcVar2 == '-') {
      usage("makeemitters","%s: unknown command flag");
    }
    if (pcVar14 != (char *)0x0) {
      pcVar14 = "multiple input filenames provided.";
      goto LAB_0026325a;
    }
    argv_local = argv_local + 1;
    pcVar14 = pcVar2;
  } while( true );
}

Assistant:

int makeemitters(int argc, char *argv[]) {
    const char *filename = nullptr;
    int downsampleRate = 1;

    auto onError = [](const std::string &err) {
        usage("makeemitters", "%s", err.c_str());
        exit(1);
    };
    while (*argv != nullptr) {
        if (ParseArg(&argv, "downsample", &downsampleRate, onError)) {
            // success
        } else if (argv[0][0] == '-')
            usage("makeemitters", "%s: unknown command flag", *argv);
        else if (!filename) {
            filename = *argv;
            ++argv;
        } else
            usage("makeemitters", "multiple input filenames provided.");
    }

    if (filename == nullptr)
        usage("makeemitters", "missing image filename");

    ImageAndMetadata im = Image::Read(filename);
    const Image &image = im.image;

    ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
    if (!rgbDesc) {
        fprintf(stderr, "%s: didn't find R, G, and B channels", filename);
        return 1;
    }

    Point2i res = image.Resolution();
    float aspect = float(res.x) / float(res.y);
    printf("AttributeBegin\n");
    printf("Material \"matte\" \"rgb Kd\" [0 0 0]\n");
    for (int y = 0; y < image.Resolution().y; y += downsampleRate)
        for (int x = 0; x < image.Resolution().x; x += downsampleRate) {
            ImageChannelValues pSum(rgbDesc.size());
            for (int dy = 0; dy < downsampleRate; ++dy)
                for (int dx = 0; dx < downsampleRate; ++dx) {
                    Point2i pp(x + dx, y + dy);
                    if (pp.x >= res.x && pp.y >= res.y)
                        continue;

                    ImageChannelValues p = image.GetChannels(pp, rgbDesc);
                    for (int c = 0; c < p.size(); ++c)
                        pSum[c] += p[c];
                }
            for (int c = 0; c < pSum.size(); ++c)
                pSum[c] /= downsampleRate * downsampleRate;

            printf("AreaLightSource \"diffuse\" \"rgb L\" [ %f %f %f ]\n", pSum[0],
                   pSum[1], pSum[2]);

            float x0 = aspect * (1 - float(x) / image.Resolution().x) - aspect / 2;
            float x1 = aspect * (1 - float(std::min(x + downsampleRate, res.x)) /
                                         image.Resolution().x) -
                       aspect / 2;
            float y0 = 1 - float(y) / image.Resolution().y;
            float y1 =
                1 - float(std::min(y + downsampleRate, res.y)) / image.Resolution().y;
            printf("Shape \"bilinear\" \"point3 P\" [ %f %f 0 %f %f 0 %f %f 0 "
                   "%f %f 0 ]\n",
                   x0, y0, x1, y0, x0, y1, x1, y1);
        }
    printf("AttributeEnd\n");

    return 0;
}